

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O2

DragDropMode __thiscall QAbstractItemView::dragDropMode(QAbstractItemView *this)

{
  int iVar1;
  bool bVar2;
  byte bVar3;
  QAbstractItemViewPrivate *d;
  DragDropMode DVar4;
  
  iVar1 = *(int *)(*(long *)(this + 8) + 0x3e0);
  bVar3 = *(byte *)(*(long *)(this + 8) + 0x3dc);
  if (bVar3 == 0) {
    bVar2 = QWidget::acceptDrops((QWidget *)this);
    if (!bVar2) {
      return NoDragDrop;
    }
    bVar3 = *(byte *)(*(long *)(this + 8) + 0x3dc);
  }
  if ((bVar3 & 1) != 0) {
    bVar2 = QWidget::acceptDrops((QWidget *)this);
    if (!bVar2) {
      return DragOnly;
    }
    bVar3 = *(byte *)(*(long *)(this + 8) + 0x3dc);
  }
  if ((bVar3 & 1) == 0) {
    bVar2 = QWidget::acceptDrops((QWidget *)this);
    if (bVar2) {
      return DropOnly;
    }
    bVar3 = *(byte *)(*(long *)(this + 8) + 0x3dc);
  }
  DVar4 = NoDragDrop;
  if (((bVar3 & 1) != 0) && (bVar2 = QWidget::acceptDrops((QWidget *)this), bVar2)) {
    DVar4 = (iVar1 == 4) + DragDrop;
  }
  return DVar4;
}

Assistant:

QAbstractItemView::DragDropMode QAbstractItemView::dragDropMode() const
{
    Q_D(const QAbstractItemView);
    DragDropMode setBehavior = d->dragDropMode;
    if (!dragEnabled() && !acceptDrops())
        return NoDragDrop;

    if (dragEnabled() && !acceptDrops())
        return DragOnly;

    if (!dragEnabled() && acceptDrops())
        return DropOnly;

    if (dragEnabled() && acceptDrops()) {
        if (setBehavior == InternalMove)
            return setBehavior;
        else
            return DragDrop;
    }

    return NoDragDrop;
}